

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_perform_list(connectdata *conn)

{
  void *pvVar1;
  CURLcode CVar2;
  char *pcVar3;
  
  pvVar1 = (conn->data->req).protop;
  if (*(long *)((long)pvVar1 + 0x38) == 0) {
    pcVar3 = "";
    if (*(char **)((long)pvVar1 + 8) != (char *)0x0) {
      pcVar3 = *(char **)((long)pvVar1 + 8);
    }
    pcVar3 = imap_atom(pcVar3);
    if (pcVar3 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    CVar2 = imap_sendf(conn,"LIST \"%s\" *",pcVar3);
    (*Curl_cfree)(pcVar3);
  }
  else {
    pcVar3 = "";
    if (*(char **)((long)pvVar1 + 0x40) != (char *)0x0) {
      pcVar3 = *(char **)((long)pvVar1 + 0x40);
    }
    CVar2 = imap_sendf(conn,"%s%s",*(long *)((long)pvVar1 + 0x38),pcVar3);
  }
  if (CVar2 == CURLE_OK) {
    (conn->proto).imapc.state = IMAP_LIST;
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

static CURLcode imap_perform_list(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct IMAP *imap = data->req.protop;
  char *mailbox;

  if(imap->custom)
    /* Send the custom request */
    result = imap_sendf(conn, "%s%s", imap->custom,
                        imap->custom_params ? imap->custom_params : "");
  else {
    /* Make sure the mailbox is in the correct atom format */
    mailbox = imap_atom(imap->mailbox ? imap->mailbox : "");
    if(!mailbox)
      return CURLE_OUT_OF_MEMORY;

    /* Send the LIST command */
    result = imap_sendf(conn, "LIST \"%s\" *", mailbox);

    free(mailbox);
  }

  if(!result)
    state(conn, IMAP_LIST);

  return result;
}